

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_public(mbedtls_rsa_context *ctx,uchar *input,uchar *output)

{
  size_t buflen;
  int iVar1;
  int iVar2;
  mbedtls_mpi T;
  
  mbedtls_mpi_init(&T);
  iVar1 = mbedtls_mpi_read_binary(&T,input,ctx->len);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_cmp_mpi(&T,&ctx->N);
    if (iVar1 < 0) {
      buflen = ctx->len;
      iVar1 = mbedtls_mpi_exp_mod(&T,&T,&ctx->E,&ctx->N,&ctx->RN);
      if (iVar1 == 0) {
        iVar1 = mbedtls_mpi_write_binary(&T,output,buflen);
      }
    }
    else {
      iVar1 = -4;
    }
  }
  mbedtls_mpi_free(&T);
  iVar2 = iVar1 + -0x4280;
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_public( mbedtls_rsa_context *ctx,
                const unsigned char *input,
                unsigned char *output )
{
    int ret;
    size_t olen;
    mbedtls_mpi T;

    mbedtls_mpi_init( &T );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &T, input, ctx->len ) );

    if( mbedtls_mpi_cmp_mpi( &T, &ctx->N ) >= 0 )
    {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    olen = ctx->len;
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &T, &T, &ctx->E, &ctx->N, &ctx->RN ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &T, output, olen ) );

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    mbedtls_mpi_free( &T );

    if( ret != 0 )
        return( MBEDTLS_ERR_RSA_PUBLIC_FAILED + ret );

    return( 0 );
}